

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_strvp.c
# Opt level: O2

ares_bool_t ares_htable_strvp_get(ares_htable_strvp_t *htable,char *key,void **val)

{
  ares_bool_t aVar1;
  void *pvVar2;
  
  if (val != (void **)0x0) {
    *val = (void *)0x0;
  }
  aVar1 = ARES_FALSE;
  if (key != (char *)0x0 && htable != (ares_htable_strvp_t *)0x0) {
    pvVar2 = ares_htable_get(htable->hash,key);
    if (pvVar2 != (void *)0x0 && val != (void **)0x0) {
      *val = *(void **)((long)pvVar2 + 8);
      aVar1 = ARES_TRUE;
    }
    else {
      aVar1 = (ares_bool_t)(pvVar2 != (void *)0x0);
    }
  }
  return aVar1;
}

Assistant:

ares_bool_t ares_htable_strvp_get(const ares_htable_strvp_t *htable,
                                  const char *key, void **val)
{
  ares_htable_strvp_bucket_t *bucket = NULL;

  if (val) {
    *val = NULL;
  }

  if (htable == NULL || key == NULL) {
    return ARES_FALSE;
  }

  bucket = ares_htable_get(htable->hash, key);
  if (bucket == NULL) {
    return ARES_FALSE;
  }

  if (val) {
    *val = bucket->val;
  }
  return ARES_TRUE;
}